

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

Gia_Man_t * Ifn_ManStrFindCofactors(int nIns,Gia_Man_t *p)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_38;
  int nMints;
  int m;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  int nIns_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  Gia_ManHashAlloc(p_00);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  nMints = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar6 = false;
    if (nMints < iVar1) {
      _m = Gia_ManCi(p,nMints);
      bVar6 = _m != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    if (nIns <= nMints) {
      uVar2 = Gia_ManAppendCi(p_00);
      _m->Value = uVar2;
    }
    nMints = nMints + 1;
  }
  for (local_38 = 0; local_38 < 1 << ((byte)nIns & 0x1f); local_38 = local_38 + 1) {
    nMints = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar6 = false;
      if (nMints < iVar1) {
        _m = Gia_ManCi(p,nMints);
        bVar6 = _m != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      if (nMints < nIns) {
        _m->Value = local_38 >> ((byte)nMints & 0x1f) & 1;
      }
      nMints = nMints + 1;
    }
    nMints = 0;
    while( true ) {
      bVar6 = false;
      if (nMints < p->nObjs) {
        _m = Gia_ManObj(p,nMints);
        bVar6 = _m != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjIsAnd(_m);
      if (iVar1 != 0) {
        iVar1 = Gia_ObjFanin0Copy(_m);
        iLit1 = Gia_ObjFanin1Copy(_m);
        uVar2 = Gia_ManHashAnd(p_00,iVar1,iLit1);
        _m->Value = uVar2;
      }
      nMints = nMints + 1;
    }
    nMints = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar6 = false;
      if (nMints < iVar1) {
        _m = Gia_ManCo(p,nMints);
        bVar6 = _m != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar1 = Gia_ObjFanin0Copy(_m);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      _m->Value = uVar2;
      nMints = nMints + 1;
    }
  }
  pGVar5 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar5;
}

Assistant:

Gia_Man_t * Ifn_ManStrFindCofactors( int nIns, Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp; 
    Gia_Obj_t * pObj;
    int i, m, nMints = 1 << nIns;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( i >= nIns )
            pObj->Value = Gia_ManAppendCi( pNew );
    for ( m = 0; m < nMints; m++ )
    {
        Gia_ManForEachCi( p, pObj, i )
            if ( i < nIns )
                pObj->Value = ((m >> i) & 1);
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}